

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void server_poll_cb(uv_poll_t *handle,int status,int events)

{
  uv_handle_t *handle_00;
  int iVar1;
  connection_context_t *handle_01;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  socklen_t addr_len;
  sockaddr_in addr;
  
  handle_00 = (uv_handle_t *)handle->data;
  addr_len = 0x10;
  iVar1 = accept(*(int *)&handle_00[2].data,(sockaddr *)&addr,&addr_len);
  eval_a = (int64_t)iVar1;
  if (eval_a < 0) {
    pcVar4 = ">=";
    pcVar3 = "sock";
    uVar2 = 0x1fa;
  }
  else {
    handle_01 = create_connection_context(iVar1,1);
    handle_01->events = 7;
    iVar1 = uv_poll_start(&handle_01->poll_handle,7,connection_poll_cb);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = *(int *)((long)&handle_00[2].data + 4) + 1;
      *(int *)((long)&handle_00[2].data + 4) = iVar1;
      if (iVar1 == 5) {
        close_socket(*(uv_os_sock_t *)&handle_00[2].data);
        uv_close(handle_00,server_close_cb);
      }
      return;
    }
    pcVar4 = "==";
    pcVar3 = "r";
    uVar2 = 0x202;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
          ,uVar2,pcVar3,pcVar4,"0",eval_a,pcVar4,0);
  abort();
}

Assistant:

static void server_poll_cb(uv_poll_t* handle, int status, int events) {
  server_context_t* server_context = (server_context_t*)
                                          handle->data;
  connection_context_t* connection_context;
  struct sockaddr_in addr;
  socklen_t addr_len;
  uv_os_sock_t sock;
  int r;

  addr_len = sizeof addr;
  sock = accept(server_context->sock, (struct sockaddr*) &addr, &addr_len);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

  connection_context = create_connection_context(sock, 1);
  connection_context->events = UV_READABLE | UV_WRITABLE | UV_DISCONNECT;
  r = uv_poll_start(&connection_context->poll_handle,
                    UV_READABLE | UV_WRITABLE | UV_DISCONNECT,
                    connection_poll_cb);
  ASSERT_OK(r);

  if (++server_context->connections == NUM_CLIENTS) {
    close_socket(server_context->sock);
    destroy_server_context(server_context);
  }
}